

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  
  iVar3 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar3 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/block.cc"
                  ,0x90,"virtual void leveldb::Block::Iter::Prev()");
  }
  uVar1 = this->current_;
  uVar4 = this->restart_index_;
  while (uVar4 = GetRestartPoint(this,uVar4), uVar1 <= uVar4) {
    if (this->restart_index_ == 0) {
      this->current_ = this->restarts_;
      this->restart_index_ = this->num_restarts_;
      return;
    }
    uVar4 = this->restart_index_ - 1;
    this->restart_index_ = uVar4;
  }
  uVar4 = this->restart_index_;
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = uVar4;
  uVar4 = GetRestartPoint(this,uVar4);
  (this->value_).data_ = this->data_ + uVar4;
  (this->value_).size_ = 0;
  do {
    bVar2 = ParseNextKey(this);
    if (!bVar2) {
      return;
    }
  } while ((uint)((*(int *)&(this->value_).data_ + (int)(this->value_).size_) - *(int *)&this->data_
                 ) < uVar1);
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }